

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_error cio_linux_socket_init
                    (cio_socket *socket,int client_fd,cio_eventloop *loop,uint64_t close_timeout_ns,
                    cio_socket_close_hook_t close_hook)

{
  cio_error err;
  cio_socket_close_hook_t close_hook_local;
  uint64_t close_timeout_ns_local;
  cio_eventloop *loop_local;
  int client_fd_local;
  cio_socket *socket_local;
  
  (socket->impl).ev.fd = client_fd;
  (socket->impl).ev.write_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
  (socket->impl).ev.read_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
  (socket->impl).ev.context = socket;
  (socket->impl).close_timeout_ns = close_timeout_ns;
  (socket->impl).peer_closed_connection = false;
  (socket->stream).read_some = stream_read;
  (socket->stream).write_some = stream_write;
  (socket->stream).close = stream_close;
  (socket->impl).loop = loop;
  socket->close_hook = close_hook;
  socket_local._4_4_ =
       cio_timer_init(&(socket->impl).close_timer,(socket->impl).loop,(cio_timer_close_hook_t)0x0);
  if (socket_local._4_4_ == CIO_SUCCESS) {
    socket_local._4_4_ = cio_linux_eventloop_add((socket->impl).loop,&(socket->impl).ev);
    if (socket_local._4_4_ == CIO_SUCCESS) {
      socket_local._4_4_ = CIO_SUCCESS;
    }
    else {
      cio_timer_close(&(socket->impl).close_timer);
    }
  }
  return socket_local._4_4_;
}

Assistant:

enum cio_error cio_linux_socket_init(struct cio_socket *socket, int client_fd,
                                     struct cio_eventloop *loop,
                                     uint64_t close_timeout_ns,
                                     cio_socket_close_hook_t close_hook)
{
	socket->impl.ev.fd = client_fd;
	socket->impl.ev.write_callback = NULL;
	socket->impl.ev.read_callback = NULL;
	socket->impl.ev.context = socket;
	socket->impl.close_timeout_ns = close_timeout_ns;

	socket->impl.peer_closed_connection = false;

	socket->stream.read_some = stream_read;
	socket->stream.write_some = stream_write;
	socket->stream.close = stream_close;

	socket->impl.loop = loop;
	socket->close_hook = close_hook;

	enum cio_error err = cio_timer_init(&socket->impl.close_timer, socket->impl.loop, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	err = cio_linux_eventloop_add(socket->impl.loop, &socket->impl.ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_timer;
	}

	return CIO_SUCCESS;

close_timer:
	cio_timer_close(&socket->impl.close_timer);
	return err;
}